

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_membuf.c
# Opt level: O2

void membuff_resize(membuff_t *mb,size_t new_size)

{
  char *pcVar1;
  
  if (mb->allocated_size < new_size) {
    pcVar1 = (char *)realloc(mb->buf,new_size);
    if (pcVar1 == (char *)0x0) {
      fwrite("out of memory\n",0xe,1,_stderr);
      exit(1);
    }
    mb->buf = pcVar1;
    mb->allocated_size = new_size;
  }
  return;
}

Assistant:

void membuff_resize(membuff_t *mb, size_t new_size) {
  if (new_size <= mb->allocated_size) return;
  char *newmem = (char *)realloc(mb->buf, new_size);
  if (newmem == NULL) {
    fprintf(stderr, "out of memory\n");
    exit(1);
  }
  mb->buf = newmem;
  mb->allocated_size = new_size;
}